

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer pBVar4;
  int *piVar5;
  Allocator *pAVar6;
  pointer pMVar7;
  long *plVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Layer *pLVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Mat *pMVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  size_t sVar18;
  int iVar19;
  long lVar20;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  int bottom_blob_index;
  int local_130;
  int local_12c;
  uint local_128;
  int local_124;
  int local_120;
  int local_11c;
  ulong local_118;
  Layer *local_110;
  Net *local_108;
  vector<int,_std::allocator<int>_> *local_100;
  int local_f4;
  vector<int,_std::allocator<int>_> *local_f0;
  ParamDict local_e8;
  Mat *local_d8;
  DataReader *local_d0;
  ulong local_c8;
  Mat local_c0;
  Mat local_78;
  
  local_f4 = 0;
  iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_f4,4);
  if (CONCAT44(extraout_var,iVar9) == 4) {
    if (local_f4 == 0x7685dd) {
      local_11c = 0;
      local_120 = 0;
      iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_11c,4);
      if (CONCAT44(extraout_var_00,iVar9) == 4) {
        iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_120,4);
        if (CONCAT44(extraout_var_01,iVar9) == 4) {
          if ((0 < (long)local_11c) && (0 < local_120)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_11c);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_120);
            ParamDict::ParamDict(&local_e8);
            if (0 < local_11c) {
              uVar14 = 0;
              local_108 = this;
              local_d0 = dr;
              do {
                iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_128,4);
                if (CONCAT44(extraout_var_02,iVar9) != 4) {
                  load_param_bin();
LAB_0016f53e:
                  iVar9 = -1;
                  goto LAB_0016f543;
                }
                iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_12c,4);
                if (CONCAT44(extraout_var_03,iVar9) != 4) {
                  load_param_bin();
                  goto LAB_0016f53e;
                }
                iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_130,4);
                if (CONCAT44(extraout_var_04,iVar9) != 4) {
                  load_param_bin();
                  goto LAB_0016f53e;
                }
                iVar9 = (*this->_vptr_Net[6])(this,(ulong)local_128);
                pLVar10 = (Layer *)CONCAT44(extraout_var_05,iVar9);
                if ((pLVar10 == (Layer *)0x0) &&
                   (pLVar10 = create_layer(local_128), pLVar10 == (Layer *)0x0)) {
                  iVar9 = (*this->_vptr_Net[5])(this,(ulong)(local_128 & 0xfffffeff));
                  pLVar10 = (Layer *)CONCAT44(extraout_var_06,iVar9);
                  if (pLVar10 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered",(ulong)local_128);
                    fputc(10,_stderr);
                    clear(this);
                    goto LAB_0016f53e;
                  }
                }
                local_f0 = &pLVar10->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_f0,(long)local_12c);
                local_110 = pLVar10;
                if (0 < local_12c) {
                  lVar12 = 0;
                  do {
                    iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
                    if (CONCAT44(extraout_var_07,iVar9) != 4) {
                      load_param_bin();
                      goto LAB_0016f53e;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)local_c0.data].consumer =
                         (int)uVar14;
                    (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12] = (int)local_c0.data;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 < local_12c);
                }
                local_100 = &local_110->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_100,(long)local_130);
                if (0 < local_130) {
                  lVar12 = 0;
                  do {
                    iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
                    if (CONCAT44(extraout_var_08,iVar9) != 4) {
                      load_param_bin();
                      goto LAB_0016f53e;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)local_c0.data].producer =
                         (int)uVar14;
                    (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12] = (int)local_c0.data;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 < local_130);
                }
                iVar9 = ParamDict::load_param_bin(&local_e8,dr);
                if (iVar9 == 0) {
                  if (local_110->support_int8_storage == true) {
                    (this->opt).use_vulkan_compute = false;
                  }
                  local_78.cstep = 0;
                  local_78.data = (void *)0x0;
                  local_78.refcount._0_4_ = 0;
                  local_78.refcount._4_4_ = 0;
                  local_78.elemsize._0_4_ = 0;
                  local_78._20_8_ = 0;
                  local_78.h = 0;
                  local_78.d = 0;
                  local_78.c = 0;
                  local_78.allocator = (Allocator *)0x0;
                  local_78.dims = 0;
                  local_78.w = 0;
                  ParamDict::get(&local_c0,&local_e8,0x1e,&local_78);
                  piVar13 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
                  if (piVar13 != (int *)0x0) {
                    LOCK();
                    *piVar13 = *piVar13 + -1;
                    UNLOCK();
                    if (*piVar13 == 0) {
                      if (local_78.allocator == (Allocator *)0x0) {
                        if (local_78.data != (void *)0x0) {
                          free(local_78.data);
                        }
                      }
                      else {
                        (*(local_78.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_c8 = uVar14;
                  if (((CONCAT44(local_c0.data._4_4_,(int)local_c0.data) != 0) &&
                      ((long)local_c0.c * local_c0.cstep != 0)) && (0 < local_130)) {
                    piVar13 = (int *)(CONCAT44(local_c0.data._4_4_,(int)local_c0.data) + 0xc);
                    lVar12 = 0;
                    do {
                      iVar9 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar12];
                      pBVar4 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar3 = piVar13[-3];
                      if (iVar3 == 3) {
                        uVar14 = (ulong)piVar13[-2];
                        iVar19 = piVar13[-1];
                        iVar17 = *piVar13;
                        sVar18 = (long)iVar19 * uVar14 + 3 & 0x3ffffffffffffffc;
                        pMVar11 = &pBVar4[iVar9].shape;
                        piVar5 = pBVar4[iVar9].shape.refcount;
                        iVar16 = 3;
                        if (piVar5 != (int *)0x0) {
                          LOCK();
                          *piVar5 = *piVar5 + -1;
                          UNLOCK();
                          if (*piVar5 == 0) {
                            pvVar15 = pBVar4[iVar9].shape.data;
                            pAVar6 = pBVar4[iVar9].shape.allocator;
                            if (pAVar6 == (Allocator *)0x0) {
LAB_0016f177:
                              pMVar11 = &pBVar4[iVar9].shape;
                              if (pvVar15 != (void *)0x0) {
                                local_124 = iVar17;
                                local_118 = uVar14;
                                local_d8 = &pBVar4[iVar9].shape;
                                free(pvVar15);
                                uVar14 = local_118;
                                pMVar11 = local_d8;
                                iVar17 = local_124;
                                iVar16 = iVar3;
                              }
                            }
                            else {
                              local_124 = iVar17;
                              local_118 = uVar14;
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar16 = 3;
                              uVar14 = local_118;
                              iVar17 = local_124;
                            }
                          }
                        }
LAB_0016f1a5:
                        pMVar11->data = (void *)0x0;
                        pMVar11->refcount = (int *)0x0;
                        pBVar4[iVar9].shape.elemsize = 4;
                        pBVar4[iVar9].shape.elempack = 1;
                        pBVar4[iVar9].shape.allocator = (Allocator *)0x0;
                        pBVar4[iVar9].shape.dims = iVar16;
                        pBVar4[iVar9].shape.w = (int)uVar14;
                        pBVar4[iVar9].shape.h = iVar19;
                        pBVar4[iVar9].shape.d = 1;
                        pBVar4[iVar9].shape.c = iVar17;
                        pBVar4[iVar9].shape.cstep = sVar18;
                        this = local_108;
                      }
                      else {
                        if (iVar3 == 2) {
                          uVar14 = (ulong)piVar13[-2];
                          iVar19 = piVar13[-1];
                          sVar18 = (long)iVar19 * uVar14;
                          pMVar11 = &pBVar4[iVar9].shape;
                          piVar5 = pBVar4[iVar9].shape.refcount;
                          iVar17 = 1;
                          iVar16 = 2;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar15 = pBVar4[iVar9].shape.data;
                              pAVar6 = pBVar4[iVar9].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) goto LAB_0016f177;
                              local_118 = uVar14;
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar16 = 2;
                              uVar14 = local_118;
                              iVar17 = 1;
                            }
                          }
                          goto LAB_0016f1a5;
                        }
                        if (iVar3 == 1) {
                          uVar14 = (ulong)(uint)piVar13[-2];
                          sVar18 = (size_t)piVar13[-2];
                          pMVar11 = &pBVar4[iVar9].shape;
                          piVar5 = pBVar4[iVar9].shape.refcount;
                          iVar16 = 1;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar15 = pBVar4[iVar9].shape.data;
                              pAVar6 = pBVar4[iVar9].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) {
                                iVar19 = 1;
                                iVar17 = 1;
                                goto LAB_0016f177;
                              }
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar19 = 1;
                              iVar17 = 1;
                              iVar16 = 1;
                              goto LAB_0016f1a5;
                            }
                          }
                          iVar19 = 1;
                          iVar17 = 1;
                          goto LAB_0016f1a5;
                        }
                      }
                      lVar12 = lVar12 + 1;
                      piVar13 = piVar13 + 4;
                    } while (lVar12 < local_130);
                  }
                  pvVar1 = &local_110->bottom_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_12c)
                  ;
                  if (0 < local_12c) {
                    lVar12 = 0;
                    lVar20 = 0;
                    iVar9 = local_12c;
                    do {
                      iVar3 = (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar20];
                      pBVar4 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar7->data + lVar12);
                      if ((Mat *)puVar2 != &pBVar4[iVar3].shape) {
                        piVar13 = pBVar4[iVar3].shape.refcount;
                        if (piVar13 != (int *)0x0) {
                          LOCK();
                          *piVar13 = *piVar13 + 1;
                          UNLOCK();
                        }
                        piVar13 = *(int **)((long)&pMVar7->refcount + lVar12);
                        if (piVar13 != (int *)0x0) {
                          LOCK();
                          *piVar13 = *piVar13 + -1;
                          UNLOCK();
                          if (*piVar13 == 0) {
                            pvVar15 = *(void **)((long)&pMVar7->data + lVar12);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar12);
                            if (plVar8 == (long *)0x0) {
                              if (pvVar15 != (void *)0x0) {
                                free(pvVar15);
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar12) = 0;
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar7->dims + lVar12);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar12) = 0;
                        piVar13 = pBVar4[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar7->data + lVar12);
                        *puVar2 = pBVar4[iVar3].shape.data;
                        puVar2[1] = piVar13;
                        *(size_t *)((long)&pMVar7->elemsize + lVar12) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar12) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar12) =
                             pBVar4[iVar3].shape.allocator;
                        iVar9 = pBVar4[iVar3].shape.w;
                        iVar19 = pBVar4[iVar3].shape.h;
                        iVar17 = pBVar4[iVar3].shape.d;
                        piVar13 = (int *)((long)&pMVar7->dims + lVar12);
                        *piVar13 = pBVar4[iVar3].shape.dims;
                        piVar13[1] = iVar9;
                        piVar13[2] = iVar19;
                        piVar13[3] = iVar17;
                        *(int *)((long)&pMVar7->c + lVar12) = pBVar4[iVar3].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar12) = pBVar4[iVar3].shape.cstep;
                        iVar9 = local_12c;
                      }
                      lVar20 = lVar20 + 1;
                      lVar12 = lVar12 + 0x48;
                      this = local_108;
                    } while (lVar20 < iVar9);
                  }
                  pvVar1 = &local_110->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_130)
                  ;
                  if (0 < local_130) {
                    lVar12 = 0;
                    lVar20 = 0;
                    iVar9 = local_130;
                    do {
                      iVar3 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar20];
                      pBVar4 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar7->data + lVar12);
                      if ((Mat *)puVar2 != &pBVar4[iVar3].shape) {
                        piVar13 = pBVar4[iVar3].shape.refcount;
                        if (piVar13 != (int *)0x0) {
                          LOCK();
                          *piVar13 = *piVar13 + 1;
                          UNLOCK();
                        }
                        piVar13 = *(int **)((long)&pMVar7->refcount + lVar12);
                        if (piVar13 != (int *)0x0) {
                          LOCK();
                          *piVar13 = *piVar13 + -1;
                          UNLOCK();
                          if (*piVar13 == 0) {
                            pvVar15 = *(void **)((long)&pMVar7->data + lVar12);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar12);
                            if (plVar8 == (long *)0x0) {
                              if (pvVar15 != (void *)0x0) {
                                free(pvVar15);
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar12) = 0;
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar7->dims + lVar12);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar12) = 0;
                        piVar13 = pBVar4[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar7->data + lVar12);
                        *puVar2 = pBVar4[iVar3].shape.data;
                        puVar2[1] = piVar13;
                        *(size_t *)((long)&pMVar7->elemsize + lVar12) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar12) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar12) =
                             pBVar4[iVar3].shape.allocator;
                        iVar9 = pBVar4[iVar3].shape.w;
                        iVar19 = pBVar4[iVar3].shape.h;
                        iVar17 = pBVar4[iVar3].shape.d;
                        piVar13 = (int *)((long)&pMVar7->dims + lVar12);
                        *piVar13 = pBVar4[iVar3].shape.dims;
                        piVar13[1] = iVar9;
                        piVar13[2] = iVar19;
                        piVar13[3] = iVar17;
                        *(int *)((long)&pMVar7->c + lVar12) = pBVar4[iVar3].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar12) = pBVar4[iVar3].shape.cstep;
                        iVar9 = local_130;
                      }
                      lVar20 = lVar20 + 1;
                      lVar12 = lVar12 + 0x48;
                      this = local_108;
                    } while (lVar20 < iVar9);
                  }
                  iVar9 = ParamDict::get(&local_e8,0x1f,0);
                  pLVar10 = local_110;
                  local_110->featmask = iVar9;
                  iVar9 = (*local_110->_vptr_Layer[2])(local_110,&local_e8);
                  uVar14 = local_c8;
                  dr = local_d0;
                  if (iVar9 == 0) {
                    (this->d->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_c8] = pLVar10;
                    iVar9 = 0;
                  }
                  else {
                    load_param_bin();
                    iVar9 = 0xe;
                  }
                  if (local_c0.refcount != (int *)0x0) {
                    LOCK();
                    *local_c0.refcount = *local_c0.refcount + -1;
                    UNLOCK();
                    if (*local_c0.refcount == 0) {
                      if (local_c0.allocator == (Allocator *)0x0) {
                        if ((void *)CONCAT44(local_c0.data._4_4_,(int)local_c0.data) != (void *)0x0)
                        {
                          free((void *)CONCAT44(local_c0.data._4_4_,(int)local_c0.data));
                        }
                      }
                      else {
                        (*(local_c0.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((iVar9 != 0xe) && (iVar9 != 0)) goto LAB_0016f53e;
                }
                else {
                  fprintf(_stderr,"ParamDict load_param %d %s failed",uVar14 & 0xffffffff,
                          (local_110->name)._M_dataplus._M_p);
                  fputc(10,_stderr);
                }
                uVar14 = uVar14 + 1;
              } while ((long)uVar14 < (long)local_11c);
            }
            iVar9 = 0;
            NetPrivate::update_input_output_indexes(this->d);
LAB_0016f543:
            ParamDict::~ParamDict(&local_e8);
            return iVar9;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_overwrite_builtin_layer(typeindex);
        if (!layer)
        {
            layer = create_layer(typeindex);
        }
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}